

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

int xmlRegexpExec(xmlRegexpPtr comp,xmlChar *content)

{
  xmlChar *content_local;
  xmlRegexpPtr comp_local;
  
  if ((comp == (xmlRegexpPtr)0x0) || (content == (xmlChar *)0x0)) {
    comp_local._4_4_ = -1;
  }
  else {
    comp_local._4_4_ = xmlFARegExec(comp,content);
  }
  return comp_local._4_4_;
}

Assistant:

int
xmlRegexpExec(xmlRegexpPtr comp, const xmlChar *content) {
    if ((comp == NULL) || (content == NULL))
	return(-1);
    return(xmlFARegExec(comp, content));
}